

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::MpRepeatedFixed<false>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  int *piVar8;
  ulong uVar9;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  ParseContext *extraout_RDX;
  ParseContext *extraout_RDX_00;
  ParseContext *ctx_00;
  uint64_t *puVar11;
  uint64_t *puVar12;
  uint *puVar13;
  uint *puVar14;
  uint uVar15;
  uint uVar16;
  LongSooRep *this;
  bool bVar18;
  bool bVar19;
  pair<const_char_*,_unsigned_int> pVar20;
  LogMessageFatal local_40;
  uint uVar17;
  
  puVar13 = (uint *)((long)&table->has_bits_offset + ((ulong)data.field_0 >> 0x20));
  if (((ulong)puVar13 & 3) != 0) {
    AlignFail(puVar13);
  }
  uVar17 = data.field_0._0_4_;
  uVar16 = uVar17 & 7;
  if (uVar16 == 2) {
    pcVar7 = MpPackedFixed<false>(msg,ptr,ctx,data,table,hasbits);
    return pcVar7;
  }
  uVar15 = *(ushort *)((long)puVar13 + 10) & 0x1c0;
  if ((ulong)uVar15 == 0xc0) {
    if (uVar16 != 1) {
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_00213cd1;
    }
    this = (LongSooRep *)((long)&msg->_vptr_MessageLite + (ulong)*puVar13);
    if (((ulong)this & 7) != 0) {
LAB_00213d58:
      AlignFail(this);
    }
    puVar11 = (uint64_t *)ptr;
    do {
      aVar10.data = *puVar11;
      uVar9 = this->elements_int;
      bVar19 = (uVar9 & 4) == 0;
      iVar5 = SooRep::size((SooRep *)this,bVar19);
      iVar6 = 1;
      if ((this->elements_int & 4) != 0) {
        iVar6 = this->capacity;
      }
      if (iVar5 == iVar6) {
        RepeatedField<unsigned_long>::Grow
                  ((RepeatedField<unsigned_long> *)this,(uVar9 & 4) == 0,iVar5,iVar5 + 1);
      }
      bVar4 = iVar5 != iVar6;
      bVar18 = bVar4 && bVar19;
      piVar8 = &this->size;
      if (!bVar4 || !bVar19) {
        piVar8 = (int *)LongSooRep::elements(this);
      }
      iVar6 = SooRep::size((SooRep *)this,bVar18);
      if ((iVar6 != iVar5 + 1) && ((this->elements_int & 4) != 0)) {
        LongSooRep::elements(this);
      }
      pcVar7 = (char *)(ulong)bVar18;
      RepeatedField<unsigned_long>::set_size((RepeatedField<unsigned_long> *)this,bVar18,iVar5 + 1);
      ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)(piVar8 + (long)iVar6 * 2))->data =
           (uint64_t)aVar10;
      ptr = (char *)(puVar11 + 1);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        iVar6 = 4;
        ctx_00 = extraout_RDX;
        goto LAB_00213c50;
      }
      bVar1 = (byte)puVar11[1];
      puVar12 = (uint64_t *)((long)puVar11 + 9);
      ctx_00 = (ParseContext *)(ulong)bVar1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar12;
        aVar10.data = (ulong)bVar2 << 7;
        uVar16 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        ctx_00 = (ParseContext *)(ulong)uVar16;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)uVar16;
          pVar20 = ReadTagFallback(ptr,uVar16);
          ctx_00 = pVar20._8_8_;
          puVar12 = (uint64_t *)pVar20.first;
        }
        else {
          puVar12 = (uint64_t *)((long)puVar11 + 10);
        }
      }
      if (puVar12 == (uint64_t *)0x0) {
        iVar6 = 5;
        goto LAB_00213c50;
      }
      puVar11 = puVar12;
    } while ((uint)ctx_00 == uVar17);
    iVar6 = 0;
LAB_00213c50:
    if (iVar6 == 0) {
LAB_00213c98:
      if (ptr < (ctx->super_EpsCopyInputStream).limit_end_) {
        uVar16 = (uint)table->fast_idx_mask & (uint)(ushort)*(uint64_t *)ptr;
        if ((uVar16 & 7) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x452);
        }
        uVar9 = (ulong)(uVar16 & 0xfffffff8);
        data.field_0 = (anon_union_8_1_898a9ca8_for_TcFieldData_0)
                       ((ulong)(ushort)*(uint64_t *)ptr ^
                       *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2));
        UNRECOVERED_JUMPTABLE = *(TailCallParseFunc *)(&table[1].has_bits_offset + uVar9);
LAB_00213cd1:
        pcVar7 = (*UNRECOVERED_JUMPTABLE)(msg,ptr,ctx,data,table,hasbits);
        return pcVar7;
      }
      uVar3 = table->has_bits_offset;
      goto LAB_00213ce5;
    }
    if (iVar6 != 4) goto LAB_00213c7b;
  }
  else {
    if (uVar15 == 0x80) {
      failure_msg = (Nonnull<const_char_*>)0x0;
    }
    else {
      failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                              ((ulong)uVar15,0x80,
                               "rep == static_cast<uint16_t>(field_layout::kRep32Bits)");
    }
    if (failure_msg != (Nonnull<const_char_*>)0x0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_40,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                 ,0x7b7,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
    }
    if (uVar16 != 5) {
      UNRECOVERED_JUMPTABLE = table->fallback;
      goto LAB_00213cd1;
    }
    this = (LongSooRep *)((long)&msg->_vptr_MessageLite + (ulong)*puVar13);
    if (((ulong)this & 7) != 0) goto LAB_00213d58;
    puVar13 = (uint *)ptr;
    do {
      uVar16 = *puVar13;
      uVar9 = this->elements_int;
      bVar19 = (uVar9 & 4) == 0;
      iVar5 = SooRep::size((SooRep *)this,bVar19);
      iVar6 = 2;
      if ((this->elements_int & 4) != 0) {
        iVar6 = this->capacity;
      }
      if (iVar5 == iVar6) {
        RepeatedField<unsigned_int>::Grow
                  ((RepeatedField<unsigned_int> *)this,(uVar9 & 4) == 0,iVar5,iVar5 + 1);
      }
      bVar4 = iVar5 != iVar6;
      bVar18 = bVar4 && bVar19;
      piVar8 = &this->size;
      if (!bVar4 || !bVar19) {
        piVar8 = (int *)LongSooRep::elements(this);
      }
      iVar6 = SooRep::size((SooRep *)this,bVar18);
      if ((iVar6 != iVar5 + 1) && ((this->elements_int & 4) != 0)) {
        LongSooRep::elements(this);
      }
      pcVar7 = (char *)(ulong)bVar18;
      RepeatedField<unsigned_int>::set_size((RepeatedField<unsigned_int> *)this,bVar18,iVar5 + 1);
      aVar10.data._4_4_ = 0;
      aVar10.data._0_4_ = uVar16;
      piVar8[iVar6] = uVar16;
      ptr = (char *)(puVar13 + 1);
      if ((ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
        iVar6 = 4;
        ctx_00 = extraout_RDX_00;
        goto LAB_00213c62;
      }
      bVar1 = (byte)puVar13[1];
      puVar14 = (uint *)((long)puVar13 + 5);
      ctx_00 = (ParseContext *)(ulong)bVar1;
      if ((char)bVar1 < '\0') {
        bVar2 = *(byte *)puVar14;
        aVar10.data = (ulong)bVar2 << 7;
        uVar16 = ((uint)bVar1 + (uint)bVar2 * 0x80) - 0x80;
        ctx_00 = (ParseContext *)(ulong)uVar16;
        if ((char)bVar2 < '\0') {
          pcVar7 = (char *)(ulong)uVar16;
          pVar20 = ReadTagFallback(ptr,uVar16);
          ctx_00 = pVar20._8_8_;
          puVar14 = (uint *)pVar20.first;
        }
        else {
          puVar14 = (uint *)((long)puVar13 + 6);
        }
      }
      if (puVar14 == (uint *)0x0) {
        iVar6 = 5;
        goto LAB_00213c62;
      }
      puVar13 = puVar14;
    } while ((uint)ctx_00 == uVar17);
    iVar6 = 0;
LAB_00213c62:
    if (iVar6 == 5) {
LAB_00213c7b:
      pcVar7 = Error(msg,pcVar7,ctx_00,(TcFieldData)aVar10,table,hasbits);
      return pcVar7;
    }
    if (iVar6 != 4) goto LAB_00213c98;
  }
  uVar3 = table->has_bits_offset;
LAB_00213ce5:
  if ((ulong)uVar3 != 0) {
    puVar13 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)uVar3);
    if (((ulong)puVar13 & 3) != 0) {
      AlignFail();
    }
    *puVar13 = *puVar13 | (uint)hasbits;
  }
  return (char *)(uint64_t *)ptr;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::MpRepeatedFixed(
    PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  const uint32_t decoded_wiretype = decoded_tag & 7;

  // Check for packed repeated fallback:
  if (decoded_wiretype == WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    PROTOBUF_MUSTTAIL return MpPackedFixed<is_split>(PROTOBUF_TC_PARAM_PASS);
  }

  void* const base = MaybeGetSplitBase(msg, is_split, table);
  const uint16_t type_card = entry.type_card;
  const uint16_t rep = type_card & field_layout::kRepMask;
  if (rep == field_layout::kRep64Bits) {
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED64) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint64_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint64_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint64_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  } else {
    ABSL_DCHECK_EQ(rep, static_cast<uint16_t>(field_layout::kRep32Bits));
    if (decoded_wiretype != WireFormatLite::WIRETYPE_FIXED32) {
      PROTOBUF_MUSTTAIL return table->fallback(PROTOBUF_TC_PARAM_PASS);
    }
    auto& field = MaybeCreateRepeatedFieldRefAt<uint32_t, is_split>(
        base, entry.offset, msg);
    constexpr auto size = sizeof(uint32_t);
    const char* ptr2 = ptr;
    uint32_t next_tag;
    do {
      ptr = ptr2;
      *field.Add() = UnalignedLoad<uint32_t>(ptr);
      ptr += size;
      if (ABSL_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
      ptr2 = ReadTag(ptr, &next_tag);
      if (ABSL_PREDICT_FALSE(ptr2 == nullptr)) goto error;
    } while (next_tag == decoded_tag);
  }

  PROTOBUF_MUSTTAIL return ToTagDispatch(PROTOBUF_TC_PARAM_NO_DATA_PASS);
parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}